

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

void __thiscall Clasp::mt::ParallelSolve::~ParallelSolve(ParallelSolve *this)

{
  LitVec *pLVar1;
  SharedData *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  unique_lock<std::mutex> *in_stack_00000008;
  ParallelSolve *in_stack_00000030;
  SharedData *pSVar2;
  
  (in_RDI->msg).field_0.str_ = (string *)&PTR__ParallelSolve_002df208;
  pSVar2 = in_RDI;
  if (1 < *(uint *)((long)&in_RDI->path[0x13].ebo_.buf + 4)) {
    doInterrupt((ParallelSolve *)0x21b968);
    SharedData::notifyWaitingThreads((SharedData *)this,in_stack_00000008,unaff_retaddr_00);
    joinThreads(in_stack_00000030);
  }
  destroyThread((ParallelSolve *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                (uint32)((ulong)pSVar2 >> 0x20));
  pLVar1 = in_RDI->path;
  if (pLVar1 != (LitVec *)0x0) {
    SharedData::~SharedData(in_RDI);
    operator_delete(pLVar1);
  }
  SolveAlgorithm::~SolveAlgorithm((SolveAlgorithm *)in_RDI);
  return;
}

Assistant:

ParallelSolve::~ParallelSolve() {
	if (shared_->nextId > 1) {
		// algorithm was not started but there may be active threads -
		// force orderly shutdown
		ParallelSolve::doInterrupt();
		shared_->notifyWaitingThreads();
		joinThreads();
	}
	destroyThread(masterId);
	delete shared_;
}